

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear_imp(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  FILE *__stream;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  int in_ECX;
  vec<IntVar_*> *in_RSI;
  BoolView *in_RDI;
  int in_stack_00000020;
  IntRelType in_stack_00000024;
  vec<IntVar_*> *in_stack_00000028;
  vec<int> *in_stack_00000030;
  uint i;
  double limit;
  bool scale;
  BoolView *in_stack_000000f8;
  int in_stack_00000100;
  IntRelType in_stack_00000104;
  vec<IntVar_*> *in_stack_00000108;
  vec<int> *in_stack_00000110;
  BoolView *in_stack_ffffffffffffff38;
  BoolView *in_stack_ffffffffffffff40;
  char *local_80;
  uint local_34;
  double local_30;
  
  bVar1 = false;
  if (in_ECX < 1) {
    in_ECX = -in_ECX;
  }
  local_30 = (double)in_ECX;
  for (local_34 = 0; uVar3 = vec<IntVar_*>::size(in_RSI), __stream = _stderr, local_34 < uVar3;
      local_34 = local_34 + 1) {
    piVar5 = vec<int>::operator[]((vec<int> *)in_RDI,local_34);
    if ((*piVar5 != 1) &&
       (piVar5 = vec<int>::operator[]((vec<int> *)in_RDI,local_34), *piVar5 != -1)) {
      bVar1 = true;
    }
    piVar5 = vec<int>::operator[]((vec<int> *)in_RDI,local_34);
    iVar4 = *piVar5;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    local_30 = (double)(iVar4 * 500000000 + 0x7fffffff) + local_30;
  }
  if (local_30 < 9.223372036854776e+18) {
    bVar2 = BoolView::isTrue(in_stack_ffffffffffffff40);
    if (bVar2) {
      if (bVar1) {
        int_linear<1>(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020);
      }
      else {
        int_linear<0>(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020);
      }
    }
    else if (bVar1) {
      BoolView::BoolView(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      int_linear_imp<1>(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_00000100,
                        in_stack_000000f8);
      BoolView::~BoolView((BoolView *)0x2605b3);
    }
    else {
      BoolView::BoolView(in_RDI,in_stack_ffffffffffffff38);
      int_linear_imp<0>(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_00000100,
                        in_stack_000000f8);
      BoolView::~BoolView((BoolView *)0x260647);
    }
    return;
  }
  pcVar6 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                   ,0x2f);
  if (pcVar6 == (char *)0x0) {
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
    ;
  }
  else {
    local_80 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                       ,0x2f);
    local_80 = local_80 + 1;
  }
  fprintf(__stream,"%s:%d: ",local_80,0x1b3);
  fprintf(_stderr,"Linear constraint may overflow, not yet supported\n");
  abort();
}

Assistant:

void int_linear_imp(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_imp<1>(a, x, t, c, r);
		} else {
			int_linear_imp<0>(a, x, t, c, r);
		}
	}
}